

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool re2::TopEqual(Regexp *a,Regexp *b)

{
  bool bVar1;
  Rune RVar2;
  Rune RVar3;
  int iVar4;
  int iVar5;
  Rune *__s1;
  Rune *__s2;
  string *psVar6;
  string *psVar7;
  CharClass *pCVar8;
  CharClass *pCVar9;
  ostream *this;
  size_t __n;
  LogMessage local_1a0;
  
  if (a->op_ == b->op_) {
    bVar1 = true;
    switch(a->op_) {
    case '\x01':
    case '\x02':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
      goto switchD_001de74c_caseD_1;
    case '\x03':
      RVar2 = Regexp::rune(a);
      RVar3 = Regexp::rune(b);
      if (RVar2 == RVar3) {
        return ((b->parse_flags_ ^ a->parse_flags_) & 1) == 0;
      }
      break;
    case '\x04':
      iVar4 = Regexp::nrunes(a);
      iVar5 = Regexp::nrunes(b);
      if ((iVar4 == iVar5) && (((b->parse_flags_ ^ a->parse_flags_) & 1) == 0)) {
        __s1 = Regexp::runes(a);
        __s2 = Regexp::runes(b);
        iVar4 = Regexp::nrunes(a);
        __n = (long)iVar4 << 2;
LAB_001de87b:
        iVar4 = bcmp(__s1,__s2,__n);
        return iVar4 == 0;
      }
      break;
    case '\x05':
    case '\x06':
      return a->nsub_ == b->nsub_;
    case '\a':
    case '\b':
    case '\t':
      return ((b->parse_flags_ ^ a->parse_flags_) & 0x40) == 0;
    case '\n':
      if (((b->parse_flags_ ^ a->parse_flags_) & 0x40) == 0) {
        iVar4 = Regexp::min(a);
        iVar5 = Regexp::min(b);
        if (iVar4 == iVar5) {
          iVar4 = Regexp::max(a);
          iVar5 = Regexp::max(b);
          goto LAB_001de835;
        }
      }
      break;
    case '\v':
      iVar4 = Regexp::cap(a);
      iVar5 = Regexp::cap(b);
      if (iVar4 == iVar5) {
        psVar6 = Regexp::name_abi_cxx11_(a);
        psVar7 = Regexp::name_abi_cxx11_(b);
        return psVar6 == psVar7;
      }
      break;
    case '\x13':
      return ((b->parse_flags_ ^ a->parse_flags_) >> 0xd & 1) == 0;
    case '\x14':
      pCVar8 = Regexp::cc(a);
      pCVar9 = Regexp::cc(b);
      if ((*(int *)(pCVar8 + 4) == *(int *)(pCVar9 + 4)) &&
         (*(int *)(pCVar8 + 0x10) == *(int *)(pCVar9 + 0x10))) {
        __n = (long)*(int *)(pCVar8 + 0x10) << 3;
        __s2 = *(Rune **)(pCVar9 + 8);
        __s1 = *(Rune **)(pCVar8 + 8);
        goto LAB_001de87b;
      }
      break;
    case '\x15':
      iVar4 = Regexp::match_id(a);
      iVar5 = Regexp::match_id(b);
LAB_001de835:
      return iVar4 == iVar5;
    default:
      LogMessage::LogMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/regexp.cc"
                 ,0x1a2);
      this = std::operator<<((ostream *)&local_1a0.str_,"Unexpected op in Regexp::Equal: ");
      std::ostream::operator<<(this,(uint)a->op_);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
    }
  }
  bVar1 = false;
switchD_001de74c_caseD_1:
  return bVar1;
}

Assistant:

Regexp* Regexp::NewLiteral(Rune rune, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpLiteral, flags);
  re->rune_ = rune;
  return re;
}